

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  int local_38 [3];
  int local_2c;
  int k;
  int j;
  Benchmark *b;
  char **ppcStack_18;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  for (b._4_4_ = 0; b._4_4_ < nbenchmarks; b._4_4_ = b._4_4_ + 1) {
    _k = benchmarks[b._4_4_];
    iVar1 = match(_k->name,(int)argv_local,ppcStack_18);
    if (iVar1 != 0) {
      for (local_2c = _k->threadlo; local_2c <= _k->threadhi; local_2c = local_2c + 1) {
        local_38[1] = 1;
        piVar2 = std::max<int>(&_k->lo,local_38 + 1);
        local_38[2] = *piVar2;
        while( true ) {
          iVar1 = local_38[2];
          local_38[0] = 1;
          piVar2 = std::max<int>(&_k->hi,local_38);
          if (*piVar2 < iVar1) break;
          RunBench(_k,local_2c,local_38[2]);
          local_38[2] = local_38[2] << 1;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char** argv) {
	for(int i = 0; i < nbenchmarks; i++) {
		Benchmark* b = benchmarks[i];
		if(match(b->name, argc, argv))
			for(int j = b->threadlo; j <= b->threadhi; j++)
				for(int k = max(b->lo, 1); k <= max(b->hi, 1); k<<=1)
					RunBench(b, j, k);
	}
}